

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *this,int subindex,
          TPZAutoPointer<TPZDohrSubstructCondense<double>_> *substruct,
          TPZAutoPointer<TPZFMatrix<double>_> *res_local)

{
  TPZDohrAssembleItem<double> *this_00;
  TPZFMatrix<double> *this_01;
  TPZAutoPointer<TPZDohrAssembleItem<double>_> *in_RCX;
  int in_ESI;
  TPZDohrAssembleItem<double> *in_RDI;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *in_stack_ffffffffffffffa0;
  TPZDohrAssembleItem<double> *rval;
  
  rval = in_RDI;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::TPZAutoPointer
            (in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZFMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFMatrix<double>_> *)in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZFMatrix<double>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_RDI);
  this_00 = (TPZDohrAssembleItem<double> *)operator_new(0x98);
  this_01 = TPZAutoPointer<TPZFMatrix<double>_>::operator->
                      ((TPZAutoPointer<TPZFMatrix<double>_> *)in_RCX);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)this_01);
  TPZDohrAssembleItem<double>::TPZDohrAssembleItem(this_00,in_ESI,in_stack_ffffffffffffff98);
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::operator=(in_RCX,rval);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}